

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.h
# Opt level: O1

int __thiscall CVmFormatter::init(CVmFormatter *this,EVP_PKEY_CTX *ctx)

{
  undefined4 uVar1;
  
  this->linepos_ = 0;
  this->linecol_ = 0;
  this->is_continuation_ = 0;
  this->linecnt_ = 0;
  this->linebuf_[0] = L'\0';
  (this->cur_color_).fg = 0x2000000;
  (this->cur_color_).bg = 0x1000000;
  (this->cur_color_).attr = 0;
  (this->os_color_).fg = (this->cur_color_).fg;
  (this->os_color_).bg = (this->cur_color_).bg;
  uVar1 = *(undefined4 *)&(this->cur_color_).field_0x14;
  (this->os_color_).attr = (this->cur_color_).attr;
  *(undefined4 *)&(this->os_color_).field_0x14 = uVar1;
  this->pending_tab_align_ = VMFMT_TAB_NONE;
  this->cur_flags_ = '\0';
  *(ushort *)&this->field_0xef81 = *(ushort *)&this->field_0xef81 & 0xfe00;
  this->html_parse_state_ = VMCON_HPS_NORMAL;
  this->html_passthru_state_ = VMCON_HPS_NORMAL;
  this->html_in_ignore_ = 0;
  this->html_in_title_ = 0;
  this->html_defer_br_ = HTML_DEFER_BR_NONE;
  this->html_quote_level_ = 0;
  this->html_pre_level_ = 0;
  this->field_0xefe8 = this->field_0xefe8 & 0xe0;
  this->field_0xf038 = this->field_0xf038 | 1;
  this->color_sp_ = 0;
  return 0;
}

Assistant:

virtual void init()
    {
        /* start out at the first column */
        linepos_ = 0;
        linecol_ = 0;
        linebuf_[0] = '\0';
        is_continuation_ = FALSE;

        /* start out in normal text color */
        cur_color_.fg = OS_COLOR_P_TEXT;
        cur_color_.bg = OS_COLOR_P_TRANSPARENT;
        cur_color_.attr = 0;
        os_color_ = cur_color_;

        /* no pending tab yet */
        pending_tab_align_ = VMFMT_TAB_NONE;

        /* start out at the first line */
        linecnt_ = 0;

        /* we're not in either "caps", "nocaps", or "allcaps" mode yet */
        capsflag_ = nocapsflag_ = allcapsflag_ = FALSE;

        /* 
         *   set the initial buffer flags: start out in word-break (not
         *   break-anywhere) more 
         */
        cur_flags_ = 0;

        /* 
         *   start in normal spacing mode - treat runs of whitespace as
         *   equivalent to a single space 
         */
        obey_whitespace_ = FALSE;

        /* start out in HTML interpretation mode */
        literal_mode_ = FALSE;

        /* presume we won't have OS-level line wrapping */
        os_line_wrap_ = FALSE;

        /* we haven't flushed a new line yet */
        just_did_nl_ = FALSE;

        /* assume that the underlying system is not HTML-enabled */
        html_target_ = FALSE;

        /* presume this target accepts OS highlighting sequences */
        plain_text_target_ = FALSE;

        /* 
         *   start out in "normal" lexical state in our parser and in the
         *   underlying output stream 
         */
        html_parse_state_ = VMCON_HPS_NORMAL;
        html_passthru_state_ = VMCON_HPS_NORMAL;

        /* not in an ignored tag yet (-> nesting depth is zero) */
        html_in_ignore_ = 0;

        /* not in title mode yet (-> nesting depth is zero) */
        html_in_title_ = 0;

        /* not yet deferring line breaks */
        html_defer_br_ = HTML_DEFER_BR_NONE;

        /* not yet in quotes (-> nesting depth is zero) */
        html_quote_level_ = 0;

        /* not in a PRE section */
        html_pre_level_ = 0;

        /* we're not parsing inside any tags yet */
        html_allow_alt_ = FALSE;
        html_allow_color_ = FALSE;
        html_in_body_ = FALSE;
        html_in_tab_ = FALSE;
        html_in_wrap_ = FALSE;

        /* assume we're a normal display stream */
        is_disp_stream_ = TRUE;

        /* no stacked colors yet */
        color_sp_ = 0;
    }